

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O0

bool __thiscall S2ShapeIndexCell::Decode(S2ShapeIndexCell *this,int num_shape_ids,Decoder *decoder)

{
  bool bVar1;
  int num_edges_00;
  ostream *poVar2;
  uint32 local_a0;
  int num_edges_3;
  uint32 shape_delta;
  byte local_89;
  S2LogMessage local_88;
  S2LogMessageVoidify local_75;
  uint local_74;
  int local_70;
  int edge_id_1;
  int i_1;
  int num_edges_2;
  uint32 shape_id_count;
  int j;
  S2ClippedShape *clipped;
  uint local_50;
  int shape_id;
  int num_clipped;
  uint32 header;
  int num_edges;
  int edge_id;
  int i;
  int num_edges_1;
  uint64 header_1;
  S2ClippedShape *clipped_1;
  Decoder *decoder_local;
  S2ShapeIndexCell *pSStack_18;
  int num_shape_ids_local;
  S2ShapeIndexCell *this_local;
  
  clipped_1 = (S2ClippedShape *)decoder;
  decoder_local._4_4_ = num_shape_ids;
  pSStack_18 = this;
  if (num_shape_ids == 1) {
    header_1 = (uint64)add_shapes(this,1);
    bVar1 = Decoder::get_varint64((Decoder *)clipped_1,(uint64 *)&i);
    if (bVar1) {
      if ((_i & 1) == 0) {
        edge_id = ((uint)(_i >> 2) & 0xf) + 2;
        S2ClippedShape::Init((S2ClippedShape *)header_1,0,edge_id);
        S2ClippedShape::set_contains_center((S2ClippedShape *)header_1,(_i & 2) != 0);
        header = (uint32)(_i >> 6);
        for (num_edges = 0; num_edges < edge_id; num_edges = num_edges + 1) {
          S2ClippedShape::set_edge((S2ClippedShape *)header_1,num_edges,header + num_edges);
        }
        this_local._7_1_ = true;
      }
      else if ((_i & 2) == 0) {
        S2ClippedShape::Init((S2ClippedShape *)header_1,0,1);
        S2ClippedShape::set_contains_center((S2ClippedShape *)header_1,(_i & 4) != 0);
        S2ClippedShape::set_edge((S2ClippedShape *)header_1,0,(int)(_i >> 3));
        this_local._7_1_ = true;
      }
      else {
        num_clipped = (int)(_i >> 3);
        S2ClippedShape::Init((S2ClippedShape *)header_1,0,num_clipped);
        S2ClippedShape::set_contains_center((S2ClippedShape *)header_1,(_i & 4) != 0);
        this_local._7_1_ = DecodeEdges(num_clipped,(S2ClippedShape *)header_1,(Decoder *)clipped_1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    bVar1 = Decoder::get_varint32(decoder,(uint32 *)&shape_id);
    if (bVar1) {
      local_50 = 1;
      if ((shape_id & 7U) == 3) {
        local_50 = (uint)shape_id >> 3;
        bVar1 = Decoder::get_varint32((Decoder *)clipped_1,(uint32 *)&shape_id);
        if (!bVar1) {
          return false;
        }
      }
      clipped._4_4_ = 0;
      _shape_id_count = add_shapes(this,local_50);
      for (num_edges_2 = 0; num_edges_2 < (int)local_50; num_edges_2 = num_edges_2 + 1) {
        if ((0 < num_edges_2) &&
           (bVar1 = Decoder::get_varint32((Decoder *)clipped_1,(uint32 *)&shape_id), !bVar1)) {
          return false;
        }
        if ((shape_id & 1U) == 0) {
          i_1 = 0;
          bVar1 = Decoder::get_varint32((Decoder *)clipped_1,(uint32 *)&i_1);
          if (!bVar1) {
            return false;
          }
          clipped._4_4_ = ((uint)i_1 >> 4) + clipped._4_4_;
          edge_id_1 = (i_1 & 0xfU) + 1;
          S2ClippedShape::Init(_shape_id_count,clipped._4_4_,edge_id_1);
          S2ClippedShape::set_contains_center(_shape_id_count,(shape_id & 2U) != 0);
          local_74 = (uint)shape_id >> 2;
          for (local_70 = 0; local_70 < edge_id_1; local_70 = local_70 + 1) {
            S2ClippedShape::set_edge(_shape_id_count,local_70,local_74 + local_70);
          }
        }
        else if ((shape_id & 7U) == 7) {
          clipped._4_4_ = ((uint)shape_id >> 4) + clipped._4_4_;
          S2ClippedShape::Init(_shape_id_count,clipped._4_4_,0);
          S2ClippedShape::set_contains_center(_shape_id_count,(shape_id & 8U) != 0);
        }
        else {
          local_89 = 0;
          if ((shape_id & 3U) != 1) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index.cc"
                       ,0xf1,kFatal,(ostream *)&std::cerr);
            local_89 = 1;
            poVar2 = S2LogMessage::stream(&local_88);
            poVar2 = std::operator<<(poVar2,"Check failed: (header & 3) == (1) ");
            S2LogMessageVoidify::operator&(&local_75,poVar2);
          }
          if ((local_89 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_88);
          }
          bVar1 = Decoder::get_varint32((Decoder *)clipped_1,&local_a0);
          if (!bVar1) {
            return false;
          }
          clipped._4_4_ = local_a0 + clipped._4_4_;
          num_edges_00 = ((uint)shape_id >> 3) + 1;
          S2ClippedShape::Init(_shape_id_count,clipped._4_4_,num_edges_00);
          S2ClippedShape::set_contains_center(_shape_id_count,(shape_id & 4U) != 0);
          bVar1 = DecodeEdges(num_edges_00,_shape_id_count,(Decoder *)clipped_1);
          if (!bVar1) {
            return false;
          }
        }
        _shape_id_count = _shape_id_count + 1;
        clipped._4_4_ = clipped._4_4_ + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2ShapeIndexCell::Decode(int num_shape_ids, Decoder* decoder) {
  // This function inverts the encodings documented above.
  if (num_shape_ids == 1) {
    // Entire S2ShapeIndex contains only one shape.
    S2ClippedShape* clipped = add_shapes(1);
    uint64 header;
    if (!decoder->get_varint64(&header)) return false;
    if ((header & 1) == 0) {
      // The cell contains a contiguous range of edges.
      int num_edges = ((header >> 2) & 15) + 2;
      clipped->Init(0 /*shape_id*/, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 6; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
      return true;
    }
    if ((header & 2) == 0) {
      // The cell contains a single edge.
      clipped->Init(0 /*shape_id*/, 1 /*num_edges*/);
      clipped->set_contains_center((header & 4) != 0);
      clipped->set_edge(0, header >> 3);
      return true;
    }
    // The cell contains some other combination of edges.
    int num_edges = header >> 3;
    clipped->Init(0 /*shape_id*/, num_edges);
    clipped->set_contains_center((header & 4) != 0);
    return DecodeEdges(num_edges, clipped, decoder);
  }
  // S2ShapeIndex contains more than one shape.
  uint32 header;
  if (!decoder->get_varint32(&header)) return false;
  int num_clipped = 1;
  if ((header & 7) == 3) {
    // This cell contains more than one shape.
    num_clipped = header >> 3;
    if (!decoder->get_varint32(&header)) return false;
  }
  int shape_id = 0;
  S2ClippedShape* clipped = add_shapes(num_clipped);
  for (int j = 0; j < num_clipped; ++j, ++clipped, ++shape_id) {
    if (j > 0 && !decoder->get_varint32(&header)) return false;
    if ((header & 1) == 0) {
      // The clipped shape contains a contiguous range of edges.
      uint32 shape_id_count = 0;
      if (!decoder->get_varint32(&shape_id_count)) return false;
      shape_id += shape_id_count >> 4;
      int num_edges = (shape_id_count & 15) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 2; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
    } else if ((header & 7) == 7) {
      // The clipped shape has no edges.
      shape_id += header >> 4;
      clipped->Init(shape_id, 0);
      clipped->set_contains_center((header & 8) != 0);
    } else {
      // The clipped shape contains some other combination of edges.
      S2_DCHECK_EQ(header & 3, 1);
      uint32 shape_delta;
      if (!decoder->get_varint32(&shape_delta)) return false;
      shape_id += shape_delta;
      int num_edges = (header >> 3) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 4) != 0);
      if (!DecodeEdges(num_edges, clipped, decoder)) return false;
    }
  }
  return true;
}